

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall
google::protobuf::MapIterator::MapIterator
          (MapIterator *this,MapFieldBase *map,Descriptor *descriptor)

{
  FieldDescriptor *pFVar1;
  
  (this->key_).type_ = 0;
  (this->value_).super_MapValueConstRef.data_ = (void *)0x0;
  (this->value_).super_MapValueConstRef.type_ = 0;
  this->map_ = map;
  pFVar1 = Descriptor::map_key(descriptor);
  (this->key_).type_ = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar1->type_ * 4);
  pFVar1 = Descriptor::map_value(descriptor);
  (this->value_).super_MapValueConstRef.type_ =
       *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar1->type_ * 4);
  return;
}

Assistant:

MapIterator(internal::MapFieldBase* map, const Descriptor* descriptor) {
    map_ = map;
    key_.SetType(descriptor->map_key()->cpp_type());
    value_.SetType(descriptor->map_value()->cpp_type());
  }